

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcSC3DMCEncoder.h
# Opt level: O0

void __thiscall
o3dgc::SC3DMCEncoder<unsigned_short>::SC3DMCEncoder(SC3DMCEncoder<unsigned_short> *this)

{
  SC3DMCEncoder<unsigned_short> *this_local;
  
  TriangleListEncoder<unsigned_short>::TriangleListEncoder(&this->m_triangleListEncoder);
  Vector<long>::Vector(&this->m_predictors);
  SC3DMCStats::SC3DMCStats(&this->m_stats);
  this->m_posSize = 0;
  this->m_quantFloatArray = (long *)0x0;
  this->m_quantFloatArraySize = 0;
  this->m_sizeBufferAC = 0;
  this->m_bufferAC = (uchar *)0x0;
  this->m_normals = (Real *)0x0;
  this->m_normalsSize = 0;
  this->m_streamType = O3DGC_STREAM_TYPE_UNKOWN;
  return;
}

Assistant:

SC3DMCEncoder(void)
                                    {
                                        m_posSize             = 0;
                                        m_quantFloatArray     = 0;
                                        m_quantFloatArraySize = 0;
                                        m_sizeBufferAC        = 0;
                                        m_bufferAC            = 0;
                                        m_normals             = 0;
                                        m_normalsSize         = 0;
                                        m_streamType          = O3DGC_STREAM_TYPE_UNKOWN;
                                    }